

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall
jsonnet::internal::Apply::Apply
          (Apply *this,LocationRange *lr,Fodder *open_fodder,AST *target,Fodder *fodder_l,
          ArgParams *args,bool trailing_comma,Fodder *fodder_r,Fodder *tailstrict_fodder,
          bool tailstrict)

{
  byte bVar1;
  byte bVar2;
  undefined8 in_RCX;
  Fodder *in_RDX;
  undefined8 in_RSI;
  LocationRange *in_RDI;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> *in_R9;
  byte in_stack_00000008;
  byte in_stack_00000020;
  AST *in_stack_ffffffffffffffb0;
  undefined6 in_stack_ffffffffffffffc8;
  
  bVar2 = in_stack_00000008 & 1;
  bVar1 = in_stack_00000020 & 1;
  AST::AST(in_stack_ffffffffffffffb0,in_RDI,(ASTType)((ulong)in_RSI >> 0x20),in_RDX);
  *(undefined ***)&in_RDI->file = &PTR__Apply_003a9fc0;
  *(undefined8 *)&in_RDI[2].file = in_RCX;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)in_R9,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffc8)));
  std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            (in_R9,(vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
                    *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffc8)));
  *(byte *)&in_RDI[2].end.column = bVar2 & 1;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)in_R9,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffc8)));
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *)in_R9,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                   *)CONCAT17(bVar2,CONCAT16(bVar1,in_stack_ffffffffffffffc8)));
  *(byte *)&in_RDI[3].end.line = bVar1 & 1;
  return;
}

Assistant:

Apply(const LocationRange &lr, const Fodder &open_fodder, AST *target, const Fodder &fodder_l,
          const ArgParams &args, bool trailing_comma, const Fodder &fodder_r,
          const Fodder &tailstrict_fodder, bool tailstrict)
        : AST(lr, AST_APPLY, open_fodder),
          target(target),
          fodderL(fodder_l),
          args(args),
          trailingComma(trailing_comma),
          fodderR(fodder_r),
          tailstrictFodder(tailstrict_fodder),
          tailstrict(tailstrict)
    {
    }